

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_one_mmuidx_locked(CPUArchState_conflict28 *env,int mmu_idx,int64_t now)

{
  CPUTLB_conflict5 *pCVar1;
  CPUTLB_conflict5 *pCVar2;
  CPUTLBDescFast *fast;
  CPUTLBDesc_conflict *desc;
  int64_t now_local;
  int mmu_idx_local;
  CPUArchState_conflict28 *env_local;
  
  pCVar1 = env_tlb(env);
  pCVar2 = env_tlb(env);
  tlb_mmu_resize_locked(env->uc,pCVar1->d + mmu_idx,pCVar2->f + mmu_idx,now);
  tlb_mmu_flush_locked(pCVar1->d + mmu_idx,pCVar2->f + mmu_idx);
  return;
}

Assistant:

static void tlb_flush_one_mmuidx_locked(CPUArchState *env, int mmu_idx,
                                        int64_t now)
{
    CPUTLBDesc *desc = &env_tlb(env)->d[mmu_idx];
    CPUTLBDescFast *fast = &env_tlb(env)->f[mmu_idx];

    tlb_mmu_resize_locked(env->uc, desc, fast, now);
    tlb_mmu_flush_locked(desc, fast);
}